

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_common.c
# Opt level: O1

void av1_calculate_segdata(segmentation *seg)

{
  int i;
  long lVar1;
  int j;
  uint uVar2;
  
  seg->segid_preskip = '\0';
  seg->last_active_segid = 0;
  lVar1 = 0;
  do {
    uVar2 = 0;
    do {
      if ((seg->feature_mask[lVar1] >> (uVar2 & 0x1f) & 1) != 0) {
        seg->segid_preskip = seg->segid_preskip | 4 < uVar2;
        seg->last_active_segid = (int)lVar1;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != 8);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  return;
}

Assistant:

void av1_calculate_segdata(struct segmentation *seg) {
  seg->segid_preskip = 0;
  seg->last_active_segid = 0;
  for (int i = 0; i < MAX_SEGMENTS; i++) {
    for (int j = 0; j < SEG_LVL_MAX; j++) {
      if (seg->feature_mask[i] & (1 << j)) {
        seg->segid_preskip |= (j >= SEG_LVL_REF_FRAME);
        seg->last_active_segid = i;
      }
    }
  }
}